

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Instr * __thiscall
GlobOpt::ToTypeSpecIndex(GlobOpt *this,Instr *instr,RegOpnd *indexOpnd,IndirOpnd *indirOpnd)

{
  BasicBlock *block;
  RegOpnd *this_00;
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  OpndKind OVar4;
  uint uVar5;
  undefined4 *puVar6;
  Value *pVVar7;
  RegOpnd **ppRVar8;
  RegOpnd *pRVar9;
  IntConstantBounds local_44;
  IntConstantBounds indexConstantBounds;
  
  if ((indirOpnd == (IndirOpnd *)0x0) && ((RegOpnd *)instr->m_src1 != indexOpnd)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c29,"(indirOpnd != nullptr || indexOpnd == instr->GetSrc1())",
                       "indirOpnd != nullptr || indexOpnd == instr->GetSrc1()");
    if (!bVar2) goto LAB_0046a60d;
    *puVar6 = 0;
  }
  uVar5 = instr->m_opcode - 0x11a;
  if ((uVar5 < 0x3c) && ((0xc00000000000003U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
LAB_0046a28e:
    BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                      ((this->currentBlock->globOptData).liveVarSyms,
                       (indexOpnd->m_sym->super_Sym).m_id);
    if (BVar3 == '\0') {
      block = this->currentBlock;
      pVVar7 = GlobOptBlockData::FindValue(&block->globOptData,&indexOpnd->m_sym->super_Sym);
      instr = ToVar(this,instr,indexOpnd,block,pVVar7,true);
    }
    return instr;
  }
  indexConstantBounds.lowerBound._0_2_ = (indexOpnd->super_Opnd).m_valueType.field_0;
  bVar2 = ValueType::IsInt((ValueType *)&indexConstantBounds);
  if (bVar2) {
    bVar2 = IsTypeSpecPhaseOff(this->func);
    if (bVar2) goto LAB_0046a28e;
  }
  else {
    indexConstantBounds.lowerBound._2_2_ = (indexOpnd->super_Opnd).m_valueType.field_0;
    bVar2 = ValueType::IsLikelyInt((ValueType *)((long)&indexConstantBounds.lowerBound + 2));
    if ((!bVar2) || ((this->field_0xf5 & 2) == 0)) goto LAB_0046a28e;
  }
  if ((*(uint *)&this->field_0xf4 >> 0x19 & 1) != 0) goto LAB_0046a28e;
  pVVar7 = GlobOptBlockData::FindValue
                     (&this->currentBlock->globOptData,&indexOpnd->m_sym->super_Sym);
  if (pVVar7 == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    unique0x10000574 = pVVar7;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c38,"(indexValue)","indexValue");
    if (!bVar2) goto LAB_0046a60d;
    *puVar6 = 0;
    pVVar7 = stack0xffffffffffffffc8;
  }
  bVar2 = ValueType::IsLikelyInt(&pVVar7->valueInfo->super_ValueType);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    unique0x1000057c = pVVar7;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c39,"(indexValue->GetValueInfo()->IsLikelyInt())",
                       "indexValue->GetValueInfo()->IsLikelyInt()");
    if (!bVar2) goto LAB_0046a60d;
    *puVar6 = 0;
    pVVar7 = stack0xffffffffffffffc8;
  }
  ToTypeSpecUse(this,instr,&indexOpnd->super_Opnd,this->currentBlock,pVVar7,indirOpnd,TyInt32,
                BailOutIntOnly,false,(Instr *)0x0);
  bVar2 = ValueType::IsInt(&pVVar7->valueInfo->super_ValueType);
  if ((!bVar2) && (this->prePassLoop == (Loop *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c3c,"(indexValue->GetValueInfo()->IsInt() || IsLoopPrePass())",
                       "indexValue->GetValueInfo()->IsInt() || IsLoopPrePass()");
    if (!bVar2) goto LAB_0046a60d;
    *puVar6 = 0;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    return instr;
  }
  ppRVar8 = &indirOpnd->m_indexOpnd;
  if (indirOpnd == (IndirOpnd *)0x0) {
    ppRVar8 = (RegOpnd **)&instr->m_src1;
  }
  this_00 = *ppRVar8;
  if (this_00 == (RegOpnd *)0x0) {
    return instr;
  }
  OVar4 = IR::Opnd::GetKind(&this_00->super_Opnd);
  if ((OVar4 == OpndKindReg) &&
     (pRVar9 = IR::Opnd::AsRegOpnd(&this_00->super_Opnd), (pRVar9->m_sym->field_0x1a & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c43,
                       "(!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec())",
                       "!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec()");
    if (!bVar2) goto LAB_0046a60d;
    *puVar6 = 0;
  }
  local_44.lowerBound = 0;
  local_44.upperBound = 0;
  bVar2 = ValueInfo::TryGetIntConstantBounds(pVVar7->valueInfo,&local_44,false);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2c45,
                       "(indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds))"
                       ,"indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds)")
    ;
    if (!bVar2) {
LAB_0046a60d:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar2 = ValueInfo::IsGreaterThanOrEqualTo
                    (pVVar7,local_44.lowerBound,local_44.upperBound,(Value *)0x0,0,0);
  if (!bVar2) {
    return instr;
  }
  (this_00->super_Opnd).m_type = TyUint32;
  return instr;
}

Assistant:

IR::Instr * 
GlobOpt::ToTypeSpecIndex(IR::Instr * instr, IR::RegOpnd * indexOpnd, IR::IndirOpnd * indirOpnd)
{
    Assert(indirOpnd != nullptr || indexOpnd == instr->GetSrc1());

    bool isGetterOrSetter = instr->m_opcode == Js::OpCode::InitGetElemI ||
        instr->m_opcode == Js::OpCode::InitSetElemI ||
        instr->m_opcode == Js::OpCode::InitClassMemberGetComputedName ||
        instr->m_opcode == Js::OpCode::InitClassMemberSetComputedName;

    if (!isGetterOrSetter // typespec is disabled for getters, setters
        && (indexOpnd->GetValueType().IsInt()
            ? !IsTypeSpecPhaseOff(func)
            : indexOpnd->GetValueType().IsLikelyInt() && DoAggressiveIntTypeSpec())
        && !GetIsAsmJSFunc()) // typespec is disabled for asmjs
    {
        StackSym *const indexVarSym = indexOpnd->m_sym;
        Value *const indexValue = CurrentBlockData()->FindValue(indexVarSym);
        Assert(indexValue);
        Assert(indexValue->GetValueInfo()->IsLikelyInt());

        ToInt32(instr, indexOpnd, currentBlock, indexValue, indirOpnd, false);
        Assert(indexValue->GetValueInfo()->IsInt() || IsLoopPrePass());

        if (!IsLoopPrePass())
        {
            IR::Opnd * intOpnd = indirOpnd ? indirOpnd->GetIndexOpnd() : instr->GetSrc1();
            if (intOpnd != nullptr)
            {
                Assert(!intOpnd->IsRegOpnd() || intOpnd->AsRegOpnd()->m_sym->IsTypeSpec());
                IntConstantBounds indexConstantBounds;
                AssertVerify(indexValue->GetValueInfo()->TryGetIntConstantBounds(&indexConstantBounds));
                if (ValueInfo::IsGreaterThanOrEqualTo(
                    indexValue,
                    indexConstantBounds.LowerBound(),
                    indexConstantBounds.UpperBound(),
                    nullptr,
                    0,
                    0))
                {
                    intOpnd->SetType(TyUint32);
                }
            }
        }
    }
    else if (!CurrentBlockData()->liveVarSyms->Test(indexOpnd->m_sym->m_id))
    {
        instr = this->ToVar(instr, indexOpnd, this->currentBlock, CurrentBlockData()->FindValue(indexOpnd->m_sym), true);
    }
    return instr;
}